

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<capnp::Capability::Client,_kj::_::PromiseAndFulfillerAdapter<capnp::Capability::Client>_>
::reject(AdapterPromiseNode<capnp::Capability::Client,_kj::_::PromiseAndFulfillerAdapter<capnp::Capability::Client>_>
         *this,Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<capnp::Capability::Client> local_1c8;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<capnp::Capability::Client,_kj::_::PromiseAndFulfillerAdapter<capnp::Capability::Client>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<capnp::Capability::Client>::ExceptionOr(&local_1c8,false,exception_00);
    ExceptionOr<capnp::Capability::Client>::operator=(&this->result,&local_1c8);
    ExceptionOr<capnp::Capability::Client>::~ExceptionOr(&local_1c8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }